

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O2

Vec_Ptr_t * Gia_ManTerTranspose(Gia_ManTer_t *p)

{
  uint uVar1;
  Vec_Ptr_t *p_00;
  uint *pInfo;
  void *pvVar2;
  ulong uVar3;
  Vec_Ptr_t *p_01;
  int i;
  
  p_00 = Vec_PtrAlloc(100);
  p_01 = p->vStates;
  uVar1 = p_01->nSize;
  for (uVar3 = 0; (long)uVar3 < (long)p->pAig->nRegs; uVar3 = uVar3 + 1) {
    if ((p->pCount0[uVar3] != p_01->nSize) && (p->pCountX[uVar3] < 1)) {
      pInfo = Gia_ManTerStateAlloc((((int)uVar1 >> 4) + 1) - (uint)((uVar1 & 0xf) == 0));
      Vec_PtrPush(p_00,pInfo);
      i = 0;
      while( true ) {
        p_01 = p->vStates;
        if (p_01->nSize <= i) break;
        pvVar2 = Vec_PtrEntry(p_01,i);
        Gia_ManTerSimInfoSet
                  (pInfo,i,*(uint *)((long)pvVar2 + (uVar3 >> 4 & 0xfffffff) * 4) >>
                           ((char)uVar3 * '\x02' & 0x1eU) & 3);
        i = i + 1;
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Gia_ManTerTranspose( Gia_ManTer_t * p )
{
    Vec_Ptr_t * vFlops;
    unsigned * pState, * pFlop;
    int i, k, nFlopWords;
    vFlops = Vec_PtrAlloc( 100 );
    nFlopWords = Abc_BitWordNum( 2*Vec_PtrSize(p->vStates) );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
    {
        if ( p->pCount0[i] == Vec_PtrSize(p->vStates) ) 
            continue;
        if ( p->pCountX[i] > 0 )
            continue;
        pFlop = Gia_ManTerStateAlloc( nFlopWords );
        Vec_PtrPush( vFlops, pFlop );
        Vec_PtrForEachEntry( unsigned *, p->vStates, pState, k )
            Gia_ManTerSimInfoSet( pFlop, k, Gia_ManTerSimInfoGet(pState, i) );
//Gia_ManTerStatePrint( pFlop, Vec_PtrSize(p->vStates), i );
    }
    return vFlops;
}